

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O0

void units::removeEscapeSequences(string *str)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ulong uStack_18;
  value_type nc;
  size_type eloc;
  string *str_local;
  
  uStack_18 = std::__cxx11::string::find_first_of((char)str,0x5c);
  while (lVar2 = std::__cxx11::string::size(), uStack_18 < lVar2 - 1U) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
    iVar1 = (int)*pcVar3;
    if ((((iVar1 - 0x28U < 2) || (iVar1 - 0x5bU < 3)) || (iVar1 == 0x7b)) || (iVar1 == 0x7d)) {
      std::__cxx11::string::erase((ulong)str,uStack_18);
    }
    uStack_18 = std::__cxx11::string::find_first_of((char)str,0x5c);
  }
  return;
}

Assistant:

static void removeEscapeSequences(std::string& str)
{
    auto eloc = str.find_first_of('\\');
    while (eloc < str.size() - 1) {
        auto nc = str[eloc + 1];
        switch (nc) {
            case '\\':
            case '{':
            case '}':
            case '(':
            case ')':
            case '[':
            case ']':
                str.erase(eloc, 1);
                break;
            default:
                break;
        }
        eloc = str.find_first_of('\\', eloc + 1);
    }
}